

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<unsigned_char> *
testing::internal::ActionResultHolder<unsigned_char>::PerformAction<unsigned_char(unsigned_short)>
          (Action<unsigned_char_(unsigned_short)> *action,type args)

{
  type this;
  Result value;
  ActionResultHolder<unsigned_char> *this_00;
  tuple<unsigned_short> local_1c;
  Wrapper local_19;
  tuple<unsigned_short> *local_18;
  type args_local;
  Action<unsigned_char_(unsigned_short)> *action_local;
  
  local_18 = args;
  args_local = (type)action;
  this_00 = (ActionResultHolder<unsigned_char> *)operator_new(0x10);
  this = args_local;
  std::tuple<unsigned_short>::tuple(&local_1c,local_18);
  value = Action<unsigned_char_(unsigned_short)>::Perform
                    ((Action<unsigned_char_(unsigned_short)> *)this,&local_1c);
  ReferenceOrValueWrapper<unsigned_char>::ReferenceOrValueWrapper(&local_19,value);
  ActionResultHolder(this_00,local_19);
  return this_00;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action,
      typename RvalueRef<typename Function<F>::ArgumentTuple>::type args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(internal::move(args))));
  }